

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createInstanceWithNullApplicationInfoTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  RefData<vk::VkInstance_s_*> data;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  PlatformInterface *vk;
  MessageBuilder *pMVar1;
  string local_4b0 [3];
  Error *err;
  Move<vk::VkInstance_s_*> local_2c0;
  RefData<vk::VkInstance_s_*> local_2a8;
  undefined1 local_290 [8];
  Unique<vk::VkInstance_s_*> instance;
  undefined1 auStack_f8 [8];
  VkInstanceCreateInfo instanceCreateInfo;
  PlatformInterface *platformInterface;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  ResultCollector resultCollector;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  resultCollector.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_70,log_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  vk = Context::getPlatformInterface(context);
  instanceCreateInfo.ppEnabledLayerNames = (char **)0x0;
  instanceCreateInfo.enabledExtensionCount = 0;
  instanceCreateInfo._52_4_ = 0;
  instanceCreateInfo.pApplicationInfo = (VkApplicationInfo *)0x0;
  instanceCreateInfo.enabledLayerCount = 0;
  instanceCreateInfo._36_4_ = 0;
  instanceCreateInfo.pNext = (void *)0x0;
  instanceCreateInfo.flags = 0;
  instanceCreateInfo._20_4_ = 0;
  instanceCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  instanceCreateInfo._4_4_ = 0;
  auStack_f8 = (undefined1  [8])0x1;
  tcu::TestLog::operator<<
            ((MessageBuilder *)
             &instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             (TestLog *)resultCollector.m_message.field_2._8_8_,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)
                      &instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
                      (char (*) [45])"Creating instance with NULL pApplicationInfo");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             &instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
  ::vk::createInstance
            (&local_2c0,vk,(VkInstanceCreateInfo *)auStack_f8,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2a8,(Move *)&local_2c0);
  data.deleter.m_destroyInstance = local_2a8.deleter.m_destroyInstance;
  data.object = local_2a8.object;
  data.deleter.m_allocator = local_2a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_290,data)
  ;
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_2c0);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&err,(TestLog *)resultCollector.m_message.field_2._8_8_,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<((MessageBuilder *)&err,(char (*) [10])"Succeeded");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&err);
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_290);
  code = tcu::ResultCollector::getResult((ResultCollector *)local_70);
  tcu::ResultCollector::getMessage_abi_cxx11_(local_4b0,(ResultCollector *)local_70);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,local_4b0);
  std::__cxx11::string::~string((string *)local_4b0);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createInstanceWithNullApplicationInfoTest (Context& context)
{
	tcu::TestLog&				log						= context.getTestContext().getLog();
	tcu::ResultCollector		resultCollector			(log);
	const PlatformInterface&	platformInterface		= context.getPlatformInterface();

	const VkInstanceCreateInfo		instanceCreateInfo		=
	{
		VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,	// VkStructureType				sType;
		DE_NULL,								// const void*					pNext;
		(VkInstanceCreateFlags)0u,				// VkInstanceCreateFlags		flags;
		DE_NULL,								// const VkApplicationInfo*		pAppInfo;
		0u,										// deUint32						layerCount;
		DE_NULL,								// const char*const*			ppEnabledLayernames;
		0u,										// deUint32						extensionCount;
		DE_NULL,								// const char*const*			ppEnabledExtensionNames;
	};

	log << TestLog::Message << "Creating instance with NULL pApplicationInfo" << TestLog::EndMessage;

	try
	{
		const Unique<VkInstance> instance(createInstance(platformInterface, &instanceCreateInfo));
		log << TestLog::Message << "Succeeded" << TestLog::EndMessage;
	}
	catch (const vk::Error& err)
	{
		resultCollector.fail("Failed, Error code: " + de::toString(err.getMessage()));
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}